

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void mp::
     WriteExpr<mp::internal::ExprTypes,mp::LinearExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
               (Writer *w,LinearExpr *linear,
               BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> nonlinear,VarNamer vnam)

{
  double value;
  size_ty sVar1;
  ptr pTVar2;
  Buffer<char> *pBVar3;
  char *pcVar4;
  pointer __src;
  size_t __n;
  bool bVar5;
  size_t sVar6;
  string *psVar7;
  ptrdiff_t _Num;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
  local_58;
  
  sVar1 = (linear->terms_).super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.
          super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size;
  if (sVar1 == 0) {
    bVar8 = false;
  }
  else {
    pTVar2 = (linear->terms_).super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
             m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr;
    lVar10 = 0;
    bVar8 = false;
    do {
      value = *(double *)((long)&pTVar2->coef_ + lVar10);
      if ((value != 0.0) || (NAN(value))) {
        bVar5 = true;
        if (bVar8) {
          pBVar3 = w->buffer_;
          sVar6 = pBVar3->size_;
          uVar9 = sVar6 + 3;
          if (pBVar3->capacity_ < uVar9) {
            (**pBVar3->_vptr_Buffer)(pBVar3,uVar9);
            sVar6 = pBVar3->size_;
          }
          pcVar4 = pBVar3->ptr_;
          pcVar4[sVar6 + 2] = ' ';
          pcVar4 = pcVar4 + sVar6;
          pcVar4[0] = ' ';
          pcVar4[1] = '+';
          pBVar3->size_ = uVar9;
          bVar5 = bVar8;
        }
        if ((value != 1.0) || (NAN(value))) {
          local_58.
          super_BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>,_void,_mp::internal::ExprTypes>
          ._vptr_BasicExprVisitor = (_func_int **)0x2000000000;
          local_58.writer_ = (Writer *)0x0;
          local_58.precedence_ = -1;
          local_58._20_1_ = 0;
          fmt::BasicWriter<char>::write_double<double>(w,value,(FormatSpec *)&local_58);
          pBVar3 = w->buffer_;
          sVar6 = pBVar3->size_;
          uVar9 = sVar6 + 3;
          if (pBVar3->capacity_ < uVar9) {
            (**pBVar3->_vptr_Buffer)(pBVar3,uVar9);
            sVar6 = pBVar3->size_;
          }
          pcVar4 = pBVar3->ptr_;
          pcVar4[sVar6 + 2] = ' ';
          pcVar4 = pcVar4 + sVar6;
          pcVar4[0] = ' ';
          pcVar4[1] = '*';
          pBVar3->size_ = uVar9;
        }
        psVar7 = BasicProblem<mp::BasicProblemParams<int>_>::item_name
                           (*(int *)((long)&pTVar2->var_index_ + lVar10),&(vnam.p_)->var_names_,
                            (int)((ulong)((long)((vnam.p_)->vars_).
                                                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)((vnam.p_)->vars_).
                                               super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4),
                            "_x[",0x7fffffff,(char *)0x0);
        __src = (psVar7->_M_dataplus)._M_p;
        __n = psVar7->_M_string_length;
        pBVar3 = w->buffer_;
        uVar9 = pBVar3->size_ + __n;
        if (pBVar3->capacity_ < uVar9) {
          (**pBVar3->_vptr_Buffer)(pBVar3,uVar9);
        }
        if (__n != 0) {
          memmove(pBVar3->ptr_ + pBVar3->size_,__src,__n);
        }
        pBVar3->size_ = uVar9;
        bVar8 = bVar5;
      }
      lVar10 = lVar10 + 0x10;
    } while (sVar1 << 4 != lVar10);
  }
  if ((nonlinear.super_ExprBase.impl_ == (Impl *)0x0) ||
     (((*(int *)nonlinear.super_ExprBase.impl_ == 1 &&
       (*(double *)((long)nonlinear.super_ExprBase.impl_ + 8) == 0.0)) &&
      (!NAN(*(double *)((long)nonlinear.super_ExprBase.impl_ + 8)))))) {
    if (!bVar8) {
      pBVar3 = w->buffer_;
      sVar6 = pBVar3->size_;
      uVar9 = sVar6 + 1;
      if (pBVar3->capacity_ < uVar9) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar9);
        sVar6 = pBVar3->size_;
      }
      pBVar3->ptr_[sVar6] = '0';
      pBVar3->size_ = uVar9;
    }
  }
  else {
    if (bVar8) {
      pBVar3 = w->buffer_;
      sVar6 = pBVar3->size_;
      uVar9 = sVar6 + 3;
      if (pBVar3->capacity_ < uVar9) {
        (**pBVar3->_vptr_Buffer)(pBVar3,uVar9);
        sVar6 = pBVar3->size_;
      }
      pcVar4 = pBVar3->ptr_;
      pcVar4[sVar6 + 2] = ' ';
      pcVar4 = pcVar4 + sVar6;
      pcVar4[0] = ' ';
      pcVar4[1] = '+';
      pBVar3->size_ = uVar9;
    }
    local_58.
    super_BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>,_void,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicExprVisitor_005d4278;
    local_58.precedence_ = 0;
    local_58.writer_ = w;
    local_58.vnam_.p_ = vnam.p_;
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    Visit(&local_58,(NumericExpr)nonlinear.super_ExprBase.impl_,-1);
  }
  return;
}

Assistant:

void WriteExpr(fmt::Writer &w, const LinearExpr &linear,
               NumericExpr nonlinear, Namer vnam={}) {
  bool have_terms = false;
  for (auto i = linear.begin(), e = linear.end(); i != e; ++i) {
    double coef = i->coef();
    if (coef != 0) {
      if (have_terms)
        w << " + ";
      else
        have_terms = true;
      if (coef != 1)
        w << coef << " * ";
      w << vnam.vname(i->var_index());
    }
  }
  if (!nonlinear || IsZero<ExprTypes>(nonlinear)) {
    if (!have_terms)
      w << "0";
    return;
  }
  if (have_terms)
    w << " + ";
  ExprWriter<ExprTypes, Namer>(w, vnam).Visit(nonlinear);
}